

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClassDefinition
          (MessageGenerator *this,Printer *printer)

{
  pointer *ppFVar1;
  undefined1 *puVar2;
  ulong uVar3;
  size_type sVar4;
  pointer pcVar5;
  string *value1;
  FileDescriptor *file;
  pointer pFVar6;
  bool bVar7;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar8;
  mapped_type *pmVar9;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *psVar10;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *psVar11;
  Descriptor *pDVar12;
  LogMessage *pLVar13;
  FieldGenerator *pFVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar15;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  char *pcVar16;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *pFVar17;
  FieldDescriptor *__tmp;
  long lVar18;
  pointer pFVar19;
  ulong uVar20;
  ulong uVar21;
  FieldGroup *pFVar22;
  int j;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  FieldGroup *pFVar27;
  __normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
  __i_1;
  FieldGroup *pFVar28;
  pointer pFVar29;
  ulong uVar30;
  __normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
  __i;
  pointer *pppFVar31;
  FieldGroup field_group;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_1;
  LogFinisher local_c9;
  FieldGroup *local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_8;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_4;
  
  if (0 < *(int *)(this->descriptor_ + 0x38)) {
    lVar24 = 0;
    do {
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar24);
      if (psVar8->ptr_ == (MessageGenerator *)0x0) {
        pcVar16 = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cxx::MessageGenerator]"
        ;
        goto LAB_001c0066;
      }
      GenerateClassDefinition(psVar8->ptr_,printer);
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print(printer,"\n");
      lVar24 = lVar24 + 1;
    } while (lVar24 < *(int *)(this->descriptor_ + 0x38));
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  field_group._0_8_ =
       &field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&field_group,"classname","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&field_group);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  iVar15 = extraout_EDX;
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
    iVar15 = extraout_EDX_00;
  }
  SimpleItoa_abi_cxx11_
            ((string *)&field_group,(protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x2c),iVar15);
  ppFVar1 = &aligned_to_1.
             super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aligned_to_1,"field_count","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&aligned_to_1);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&field_group);
  if (aligned_to_1.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
    operator_delete(aligned_to_1.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(aligned_to_1.
                                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   preferred_location_ + 1));
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  sVar4 = (this->options_).dllexport_decl._M_string_length;
  field_group._0_8_ =
       &field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&field_group,"dllexport","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&field_group);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x2313f7);
    pDVar12 = extraout_RDX_01;
  }
  else {
    pcVar5 = (this->options_).dllexport_decl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&field_group,pcVar5,pcVar5 + sVar4);
    std::__cxx11::string::append((char *)&field_group);
    aligned_to_1.
    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aligned_to_1,"dllexport","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&aligned_to_1);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&field_group);
    pDVar12 = extraout_RDX;
    if (aligned_to_1.
        super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
      operator_delete(aligned_to_1.
                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(aligned_to_1.
                                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     preferred_location_ + 1));
      pDVar12 = extraout_RDX_00;
    }
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
    pDVar12 = extraout_RDX_02;
  }
  SuperClassName_abi_cxx11_((string *)&field_group,(cxx *)this->descriptor_,pDVar12);
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aligned_to_1,"superclass","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&aligned_to_1);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&field_group);
  if (aligned_to_1.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
    operator_delete(aligned_to_1.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(aligned_to_1.
                                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   preferred_location_ + 1));
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  io::Printer::Print(printer,&vars,
                     "class $dllexport$$classname$ : public $superclass$ {\n public:\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "$classname$();\nvirtual ~$classname$();\n\n$classname$(const $classname$& from);\n\ninline $classname$& operator=(const $classname$& from) {\n  CopyFrom(from);\n  return *this;\n}\n\n"
                    );
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n  return _unknown_fields_;\n}\n\ninline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n  return &_unknown_fields_;\n}\n\n"
                      );
  }
  lVar24 = *(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88);
  if ((*(int *)(lVar24 + 0x50) != 3) &&
     (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x59) == '\0')) {
    io::Printer::Print(printer,&vars,"static const ::google::protobuf::Descriptor* descriptor();\n")
    ;
  }
  io::Printer::Print(printer,&vars,"static const $classname$& default_instance();\n\n");
  bVar7 = StaticInitializersForced(*(FileDescriptor **)(this->descriptor_ + 0x10));
  if (!bVar7) {
    io::Printer::Print(printer,&vars,
                       "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n// Returns the internal default instance pointer. This function can\n// return NULL thus should not be used by the user. This is intended\n// for Protobuf internal code. Please use default_instance() declared\n// above instead.\nstatic inline const $classname$* internal_default_instance() {\n  return default_instance_;\n}\n#endif\n\n"
                      );
  }
  io::Printer::Print(printer,&vars,
                     "void Swap($classname$* other);\n\n// implements Message ----------------------------------------------\n\n$classname$* New() const;\n"
                    );
  iVar15 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  if (iVar15 != 2) {
    if (iVar15 == 3) {
      pcVar16 = "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n";
    }
    else {
      pcVar16 = 
      "void CopyFrom(const ::google::protobuf::Message& from);\nvoid MergeFrom(const ::google::protobuf::Message& from);\n"
      ;
    }
    io::Printer::Print(printer,&vars,pcVar16);
    io::Printer::Print(printer,&vars,
                       "void CopyFrom(const $classname$& from);\nvoid MergeFrom(const $classname$& from);\nvoid Clear();\nbool IsInitialized() const;\n\nint ByteSize() const;\nbool MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input);\nvoid SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const;\n"
                      );
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 1) {
      io::Printer::Print(printer,
                         "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n"
                        );
    }
  }
  io::Printer::Print(printer,&vars,
                     "int GetCachedSize() const { return _cached_size_; }\nprivate:\nvoid SharedCtor();\nvoid SharedDtor();\nvoid SetCachedSize(int size) const;\npublic:\n\n"
                    );
  pcVar16 = "::google::protobuf::Metadata GetMetadata() const;\n\n";
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    pcVar16 = "::std::string GetTypeName() const;\n\n";
  }
  io::Printer::Print(printer,pcVar16);
  io::Printer::Print(printer,
                     "// xml support -----------------------------------------------------\n\n");
  io::Printer::Print(printer,&vars,
                     "// Parse a protocol buffer contained in a string.\nbool ParseFromXmlString(const std::string& data);\n// Like ParseFromXmlString(), but accepts messages that are missing\n// required fields.\nbool ParsePartialFromXmlString(const std::string& data);\n\n// Serialize the message and store it in the given string.  All required\n// fields must be set.\nbool SerializeToXmlString(std::string* output) const;\n// Like SerializeToXmlString(), but allows missing required fields.\nbool SerializePartialToXmlString(std::string* output) const;\n\n"
                    );
  io::Printer::Print(printer,
                     "// nested types ----------------------------------------------------\n\n");
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x38)) {
    lVar18 = 0;
    lVar25 = 0;
    do {
      value1 = *(string **)(*(long *)(pDVar12 + 0x40) + lVar18);
      ClassName_abi_cxx11_
                ((string *)&field_group,(cxx *)(*(long *)(pDVar12 + 0x40) + lVar18),
                 (Descriptor *)0x0,SUB81(lVar24,0));
      io::Printer::Print(printer,"typedef $nested_full_name$ $nested_name$;\n","nested_name",value1,
                         "nested_full_name",(string *)&field_group);
      if ((pointer *)field_group._0_8_ !=
          &field_group.fields_.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)field_group._0_8_,
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1);
      }
      lVar25 = lVar25 + 1;
      pDVar12 = this->descriptor_;
      lVar24 = (long)*(int *)(pDVar12 + 0x38);
      lVar18 = lVar18 + 0x78;
    } while (lVar25 < lVar24);
    if (0 < *(int *)(pDVar12 + 0x38)) {
      io::Printer::Print(printer,"\n");
    }
  }
  if (0 < *(int *)(this->descriptor_ + 0x48)) {
    lVar24 = 0;
    do {
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
                ::operator[](&this->enum_generators_,lVar24);
      if (psVar10->ptr_ == (EnumGenerator *)0x0) {
        pcVar16 = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cxx::EnumGenerator]"
        ;
        goto LAB_001c0066;
      }
      EnumGenerator::GenerateSymbolImports(psVar10->ptr_,printer);
      io::Printer::Print(printer,"\n");
      lVar24 = lVar24 + 1;
    } while (lVar24 < *(int *)(this->descriptor_ + 0x48));
  }
  io::Printer::Print(printer,
                     "// accessors -------------------------------------------------------\n\n");
  GenerateFieldAccessorDeclarations(this,printer);
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x68)) {
    lVar24 = 0;
    do {
      psVar11 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_,lVar24);
      if (psVar11->ptr_ == (ExtensionGenerator *)0x0) {
        pcVar16 = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cxx::ExtensionGenerator]"
        ;
LAB_001c0066:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,pcVar16);
      }
      ExtensionGenerator::GenerateDeclaration(psVar11->ptr_,printer);
      lVar24 = lVar24 + 1;
      pDVar12 = this->descriptor_;
    } while (lVar24 < *(int *)(pDVar12 + 0x68));
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)(pDVar12 + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," private:\n");
  io::Printer::Indent(printer);
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x2c)) {
    lVar24 = 0;
    lVar18 = 0;
    pFVar17 = extraout_RDX_03;
    do {
      if (*(int *)(*(long *)(pDVar12 + 0x30) + 0x30 + lVar24) != 3) {
        FieldName_abi_cxx11_
                  ((string *)&field_group,(cxx *)(*(long *)(pDVar12 + 0x30) + lVar24),pFVar17);
        io::Printer::Print(printer,"inline void set_has_$name$();\n","name",(string *)&field_group);
        pFVar17 = extraout_RDX_04;
        if ((pointer *)field_group._0_8_ !=
            &field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)field_group._0_8_,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
          pFVar17 = extraout_RDX_05;
        }
        FieldName_abi_cxx11_
                  ((string *)&field_group,(cxx *)(*(long *)(this->descriptor_ + 0x30) + lVar24),
                   pFVar17);
        io::Printer::Print(printer,"inline void clear_has_$name$();\n","name",(string *)&field_group
                          );
        pFVar17 = extraout_RDX_06;
        if ((pointer *)field_group._0_8_ !=
            &field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)field_group._0_8_,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
          pFVar17 = extraout_RDX_07;
        }
      }
      lVar18 = lVar18 + 1;
      pDVar12 = this->descriptor_;
      lVar24 = lVar24 + 0x78;
    } while (lVar18 < *(int *)(pDVar12 + 0x2c));
  }
  io::Printer::Print(printer,"\n");
  if (0 < *(int *)(this->descriptor_ + 0x58)) {
    io::Printer::Print(printer,"::google::protobuf::internal::ExtensionSet _extensions_;\n\n");
  }
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"::google::protobuf::UnknownFieldSet _unknown_fields_;\n\n");
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x2c)) {
    lVar24 = 0;
    lVar18 = 0;
    do {
      field_group._0_8_ = *(long *)(pDVar12 + 0x30) + lVar24;
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&fields,(FieldDescriptor **)&field_group);
      lVar18 = lVar18 + 1;
      pDVar12 = this->descriptor_;
      lVar24 = lVar24 + 0x78;
    } while (lVar18 < *(int *)(pDVar12 + 0x2c));
  }
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar26 = 0;
    do {
      pFVar17 = fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar26];
      iVar15 = 0;
      if ((pFVar17 != (FieldDescriptor *)0x0) && (iVar15 = 8, *(int *)(pFVar17 + 0x30) != 3)) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar17 + 0x2c) * 4) - 1U
            < 10) {
          iVar15 = *(int *)(&DAT_0024dd9c +
                           (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                           (ulong)*(uint *)(pFVar17 + 0x2c) * 4) - 1U) * 4);
        }
        else {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&field_group,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                     ,0xb4);
          pLVar13 = internal::LogMessage::operator<<((LogMessage *)&field_group,"Can\'t get here.");
          internal::LogFinisher::operator=(&local_c9,pLVar13);
          internal::LogMessage::~LogMessage((LogMessage *)&field_group);
          iVar15 = -1;
        }
      }
      iVar23 = (int)uVar26;
      if (iVar15 == 1) {
        pFVar17 = fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar26];
        field_group.preferred_location_ = (float)iVar23;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        *field_group.fields_.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_start = pFVar17;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        std::
        vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ::push_back(&aligned_to_1,&field_group);
LAB_001bfa99:
        if (field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        if (iVar15 == 4) {
          pFVar17 = fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar26];
          field_group.preferred_location_ = (float)iVar23;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               field_group.fields_.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
          *field_group.fields_.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start = pFVar17;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               field_group.fields_.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::
          vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
          ::push_back(&aligned_to_4,&field_group);
          goto LAB_001bfa99;
        }
        if (iVar15 == 8) {
          pFVar17 = fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar26];
          field_group.preferred_location_ = (float)iVar23;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               field_group.fields_.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
          *field_group.fields_.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start = pFVar17;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               field_group.fields_.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::
          vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
          ::push_back(&aligned_to_8,&field_group);
          goto LAB_001bfa99;
        }
        internal::LogMessage::LogMessage
                  ((LogMessage *)&field_group,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                   ,0xf4);
        pLVar13 = internal::LogMessage::operator<<
                            ((LogMessage *)&field_group,"Unknown alignment size.");
        internal::LogFinisher::operator=(&local_c9,pLVar13);
        internal::LogMessage::~LogMessage((LogMessage *)&field_group);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((long)aligned_to_1.
            super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)aligned_to_1.
            super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    pFVar28 = (FieldGroup *)
              ((long)aligned_to_1.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)aligned_to_1.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    pFVar19 = aligned_to_1.
              super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar27 = (FieldGroup *)0x0;
    local_c8 = pFVar28;
    do {
      field_group._0_8_ = field_group._0_8_ & 0xffffffff00000000;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar2 = &pFVar27->field_0x4;
      if (pFVar27 < pFVar28) {
        pFVar28 = pFVar19;
        pFVar22 = (FieldGroup *)puVar2;
        if (local_c8 < puVar2) {
          pFVar22 = local_c8;
        }
        do {
          anon_unknown_0::FieldGroup::Append(&field_group,pFVar28);
          pFVar27 = (FieldGroup *)((long)&pFVar27->preferred_location_ + 1);
          pFVar28 = pFVar28 + 1;
        } while (pFVar27 < pFVar22);
      }
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::push_back(&aligned_to_4,&field_group);
      pFVar28 = local_c8;
      if (field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(field_group.fields_.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pFVar19 = pFVar19 + 4;
      pFVar27 = (FieldGroup *)puVar2;
    } while (puVar2 < pFVar28);
  }
  pFVar6 = aligned_to_4.
           super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar19 = aligned_to_4.
            super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (aligned_to_4.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      aligned_to_4.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar18 = (long)aligned_to_4.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)aligned_to_4.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar26 = lVar18 >> 5;
    lVar24 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (aligned_to_4.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_start,
               aligned_to_4.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar18 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar6);
    }
    else {
      pFVar29 = pFVar19 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar29);
      for (; pFVar29 != pFVar6; pFVar29 = pFVar29 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pFVar29);
      }
    }
  }
  if ((long)pFVar6 - (long)pFVar19 != 0) {
    uVar20 = (long)pFVar6 - (long)pFVar19 >> 5;
    uVar26 = 0;
    do {
      field_group._0_8_ = field_group._0_8_ & 0xffffffff00000000;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar3 = uVar26 + 2;
      local_c8 = pFVar19;
      if (uVar26 < uVar20) {
        uVar30 = uVar26;
        uVar21 = uVar3;
        if (uVar20 < uVar3) {
          uVar21 = uVar20;
        }
        do {
          anon_unknown_0::FieldGroup::Append(&field_group,pFVar19);
          uVar30 = uVar30 + 1;
          pFVar19 = pFVar19 + 1;
        } while (uVar30 < uVar21);
      }
      pFVar28 = local_c8;
      if (uVar20 - 1 == uVar26) {
        field_group.preferred_location_ =
             (float)(((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      }
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::push_back(&aligned_to_8,&field_group);
      if (field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(field_group.fields_.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pFVar19 = pFVar28 + 2;
      uVar26 = uVar3;
    } while (uVar3 < uVar20);
  }
  pFVar6 = aligned_to_8.
           super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar19 = aligned_to_8.
            super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (aligned_to_8.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      aligned_to_8.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar18 = (long)aligned_to_8.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)aligned_to_8.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar26 = lVar18 >> 5;
    lVar24 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (aligned_to_8.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_start,
               aligned_to_8.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar18 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar6);
    }
    else {
      pFVar29 = pFVar19 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar29);
      for (; pFVar29 != pFVar6; pFVar29 = pFVar29 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pFVar29);
      }
    }
  }
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pFVar19 != pFVar6) {
    lVar24 = (long)pFVar6 - (long)pFVar19 >> 5;
    lVar24 = lVar24 + (ulong)(lVar24 == 0);
    pppFVar31 = &(pFVar19->fields_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&fields,
                 fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 ((_Vector_impl_data *)(pppFVar31 + -1))->_M_start,*pppFVar31);
      pppFVar31 = pppFVar31 + 4;
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector(&aligned_to_8);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector(&aligned_to_4);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector(&aligned_to_1);
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar26 = 0;
    do {
      pFVar14 = FieldGeneratorMap::get
                          (&this->field_generators_,
                           fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar26]);
      (*pFVar14->_vptr_FieldGenerator[2])(pFVar14,printer);
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  io::Printer::Print(printer,"\nmutable int _cached_size_;\n");
  if (*(int *)(this->descriptor_ + 0x2c) < 1) {
    io::Printer::Print(printer,"::google::protobuf::uint32 _has_bits_[1];\n\n");
  }
  else {
    io::Printer::Print(printer,&vars,
                       "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n\n");
  }
  file = *(FileDescriptor **)(this->descriptor_ + 0x10);
  GlobalAddDescriptorsName
            ((string *)&field_group,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  PrintHandlingOptionalStaticInitializers
            (file,printer,"friend void $dllexport_decl$ $adddescriptorsname$();\n",
             "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n","dllexport_decl",
             &(this->options_).dllexport_decl,"adddescriptorsname",(string *)&field_group);
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  GlobalAssignDescriptorsName
            ((string *)&field_group,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  GlobalShutdownFileName
            ((string *)&aligned_to_1,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  io::Printer::Print(printer,
                     "friend void $assigndescriptorsname$();\nfriend void $shutdownfilename$();\n\n"
                     ,"assigndescriptorsname",(string *)&field_group,"shutdownfilename",
                     (string *)&aligned_to_1);
  if (aligned_to_1.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&aligned_to_1.
                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(aligned_to_1.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(aligned_to_1.
                                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   preferred_location_ + 1));
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  io::Printer::Print(printer,
                     "void InitAsDefaultInstance();\nstatic $classname$* default_instance_;\n",
                     "classname",&this->classname_);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&vars,"};");
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::
GenerateClassDefinition(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassDefinition(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  map<string, string> vars;
  vars["classname"] = classname_;
  vars["field_count"] = SimpleItoa(descriptor_->field_count());
  if (options_.dllexport_decl.empty()) {
    vars["dllexport"] = "";
  } else {
    vars["dllexport"] = options_.dllexport_decl + " ";
  }
  vars["superclass"] = SuperClassName(descriptor_);

  printer->Print(vars,
    "class $dllexport$$classname$ : public $superclass$ {\n"
    " public:\n");
  printer->Indent();

  printer->Print(vars,
    "$classname$();\n"
    "virtual ~$classname$();\n"
    "\n"
    "$classname$(const $classname$& from);\n"
    "\n"
    "inline $classname$& operator=(const $classname$& from) {\n"
    "  CopyFrom(from);\n"
    "  return *this;\n"
    "}\n"
    "\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n"
      "  return _unknown_fields_;\n"
      "}\n"
      "\n"
      "inline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n"
      "  return &_unknown_fields_;\n"
      "}\n"
      "\n");
  }

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(vars,
      "static const ::google::protobuf::Descriptor* descriptor();\n");
  }

  printer->Print(vars,
    "static const $classname$& default_instance();\n"
    "\n");

  if (!StaticInitializersForced(descriptor_->file())) {
    printer->Print(vars,
      "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
      "// Returns the internal default instance pointer. This function can\n"
      "// return NULL thus should not be used by the user. This is intended\n"
      "// for Protobuf internal code. Please use default_instance() declared\n"
      "// above instead.\n"
      "static inline const $classname$* internal_default_instance() {\n"
      "  return default_instance_;\n"
      "}\n"
      "#endif\n"
      "\n");
  }


  printer->Print(vars,
    "void Swap($classname$* other);\n"
    "\n"
    "// implements Message ----------------------------------------------\n"
    "\n"
    "$classname$* New() const;\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    if (HasDescriptorMethods(descriptor_->file())) {
      printer->Print(vars,
        "void CopyFrom(const ::google::protobuf::Message& from);\n"
        "void MergeFrom(const ::google::protobuf::Message& from);\n");
    } else {
      printer->Print(vars,
        "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n");
    }

    printer->Print(vars,
      "void CopyFrom(const $classname$& from);\n"
      "void MergeFrom(const $classname$& from);\n"
      "void Clear();\n"
      "bool IsInitialized() const;\n"
      "\n"
      "int ByteSize() const;\n"
      "bool MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input);\n"
      "void SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const;\n");
    if (HasFastArraySerialization(descriptor_->file())) {
      printer->Print(
        "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n");
    }
  }

  printer->Print(vars,
    "int GetCachedSize() const { return _cached_size_; }\n"
    "private:\n"
    "void SharedCtor();\n"
    "void SharedDtor();\n"
    "void SetCachedSize(int size) const;\n"
    "public:\n"
    "\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata GetMetadata() const;\n"
      "\n");
  } else {
    printer->Print(
      "::std::string GetTypeName() const;\n"
      "\n");
  }

  printer->Print(
    "// xml support -----------------------------------------------------\n"
    "\n");

  printer->Print(vars,
    "// Parse a protocol buffer contained in a string.\n"
    "bool ParseFromXmlString(const std::string& data);\n"
    "// Like ParseFromXmlString(), but accepts messages that are missing\n"
    "// required fields.\n"
    "bool ParsePartialFromXmlString(const std::string& data);\n"
    "\n"
    "// Serialize the message and store it in the given string.  All required\n"
    "// fields must be set.\n"
    "bool SerializeToXmlString(std::string* output) const;\n"
    "// Like SerializeToXmlString(), but allows missing required fields.\n"
    "bool SerializePartialToXmlString(std::string* output) const;\n"
    "\n");

  printer->Print(
    "// nested types ----------------------------------------------------\n"
    "\n");

  // Import all nested message classes into this class's scope with typedefs.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    const Descriptor* nested_type = descriptor_->nested_type(i);
    printer->Print("typedef $nested_full_name$ $nested_name$;\n",
                   "nested_name", nested_type->name(),
                   "nested_full_name", ClassName(nested_type, false));
  }

  if (descriptor_->nested_type_count() > 0) {
    printer->Print("\n");
  }

  // Import all nested enums and their values into this class's scope with
  // typedefs and constants.
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateSymbolImports(printer);
    printer->Print("\n");
  }

  printer->Print(
    "// accessors -------------------------------------------------------\n"
    "\n");

  // Generate accessor methods for all fields.
  GenerateFieldAccessorDeclarations(printer);

  // Declare extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }


  printer->Print(
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  // Generate private members.
  printer->Outdent();
  printer->Print(" private:\n");
  printer->Indent();


  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->is_repeated()) {
      printer->Print(
        "inline void set_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
      printer->Print(
        "inline void clear_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
    }
  }
  printer->Print("\n");

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.

  // Members assumed to align to 8 bytes:

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "::google::protobuf::internal::ExtensionSet _extensions_;\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::UnknownFieldSet _unknown_fields_;\n"
      "\n");
  }

  // Field members:

  vector<const FieldDescriptor*> fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields.push_back(descriptor_->field(i));
  }
  OptimizePadding(&fields);
  for (int i = 0; i < fields.size(); ++i) {
    field_generators_.get(fields[i]).GeneratePrivateMembers(printer);
  }

  // Members assumed to align to 4 bytes:

  // TODO(kenton):  Make _cached_size_ an atomic<int> when C++ supports it.
  printer->Print(
      "\n"
      "mutable int _cached_size_;\n");

  // Generate _has_bits_.
  if (descriptor_->field_count() > 0) {
    printer->Print(vars,
      "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n"
      "\n");
  } else {
    // Zero-size arrays aren't technically allowed, and MSVC in particular
    // doesn't like them.  We still need to declare these arrays to make
    // other code compile.  Since this is an uncommon case, we'll just declare
    // them with size 1 and waste some space.  Oh well.
    printer->Print(
      "::google::protobuf::uint32 _has_bits_[1];\n"
      "\n");
  }

  // Declare AddDescriptors(), BuildDescriptors(), and ShutdownFile() as
  // friends so that they can access private static variables like
  // default_instance_ and reflection_.
  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "friend void $dllexport_decl$ $adddescriptorsname$();\n",
    // Without.
    "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n",
    // Vars.
    "dllexport_decl", options_.dllexport_decl,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "friend void $assigndescriptorsname$();\n"
    "friend void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname",
      GlobalAssignDescriptorsName(descriptor_->file()->name()),
    "shutdownfilename", GlobalShutdownFileName(descriptor_->file()->name()));

  printer->Print(
    "void InitAsDefaultInstance();\n"
    "static $classname$* default_instance_;\n",
    "classname", classname_);

  printer->Outdent();
  printer->Print(vars, "};");
}